

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.c
# Opt level: O1

rt_function_error_t exec_deconvolution(rt_function_t *f)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  uint *puVar5;
  void *__s;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int *piVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  rt_list_t shape;
  rt_list_t shape_00;
  rt_list_t shape_01;
  rt_list_t shape_02;
  rt_list_t out;
  rt_list_t out_00;
  rt_list_t shape_03;
  rt_list_t shape_04;
  rt_list_t shape_05;
  rt_list_t pos;
  int local_90;
  int local_8c;
  float local_84;
  int local_80;
  
  plVar3 = (long *)f->local_context;
  plVar4 = (long *)*plVar3;
  shape._4_4_ = 0;
  shape.size = *(uint *)(plVar4 + 0xb);
  shape.data = (int *)plVar4[0xc];
  uVar13 = calc_shape_size(shape);
  shape_00._4_4_ = 0;
  shape_00.size = *(uint *)(plVar4 + 0xd);
  shape_00.data = (int *)plVar4[0xe];
  uVar14 = calc_shape_size(shape_00);
  shape_01._4_4_ = 0;
  shape_01.size = *(uint *)(plVar4 + 9);
  shape_01.data = (int *)plVar4[10];
  iVar15 = calc_shape_size(shape_01);
  puVar5 = (uint *)plVar4[6];
  __s = *(void **)(puVar5 + 6);
  shape_02._4_4_ = 0;
  shape_02.size = *puVar5;
  shape_02.data = *(int **)(puVar5 + 2);
  iVar16 = calc_shape_size(shape_02);
  memset(__s,0,(long)iVar16 << 2);
  if (0 < *(int *)((long)plVar4 + 0x9c)) {
    local_8c = 0;
    do {
      if (0 < (int)plVar3[8]) {
        local_90 = 0;
        do {
          uVar1 = *(uint *)(*(long *)(plVar4[2] + 8) + 4);
          uVar25 = (ulong)uVar1;
          if (0 < (int)uVar1) {
            lVar24 = 0;
            do {
              iVar16 = (int)plVar3[8];
              iVar26 = ((iVar16 * local_8c + local_90) * (int)uVar25 + (int)lVar24) * uVar13;
              piVar23 = *(int **)(plVar4[2] + 8);
              iVar20 = *piVar23;
              if (0 < iVar20 / iVar16) {
                local_80 = 0;
                do {
                  if (0 < (int)uVar13) {
                    iVar2 = piVar23[1];
                    uVar25 = 0;
                    do {
                      out._4_4_ = 0;
                      out.size = *(uint *)(plVar4 + 0x11);
                      shape_04._4_4_ = 0;
                      shape_04.size = *(uint *)(plVar4 + 0xb);
                      out.data = (int *)plVar4[0x12];
                      shape_04.data = (int *)plVar4[0xc];
                      pos_to_shape(out,shape_04,(int)uVar25);
                      if ((int)uVar14 < 1) {
                        local_84 = 0.0;
                      }
                      else {
                        local_84 = 0.0;
                        uVar28 = 0;
                        do {
                          out_00._4_4_ = 0;
                          out_00.size = *(uint *)(plVar4 + 0xf);
                          shape_05._4_4_ = 0;
                          shape_05.size = *(uint *)(plVar4 + 0xd);
                          out_00.data = (int *)plVar4[0x10];
                          shape_05.data = (int *)plVar4[0xe];
                          pos_to_shape(out_00,shape_05,(int)uVar28);
                          if ((int)plVar4[0x13] < 1) {
LAB_0011cf34:
                            lVar19 = *(long *)(*plVar4 + 0x18);
                            shape_03._4_4_ = 0;
                            shape_03.size = *(uint *)(plVar4 + 9);
                            pos._4_4_ = 0;
                            pos.size = *(uint *)(plVar4 + 0xf);
                            shape_03.data = (int *)plVar4[10];
                            pos.data = (int *)plVar4[0x10];
                            iVar18 = shape_to_pos(shape_03,pos);
                            local_84 = local_84 +
                                       *(float *)(lVar19 + (long)(((iVar20 * local_90) / iVar16 +
                                                                  iVar20 * local_8c + local_80) *
                                                                 iVar15) * 4 + (long)iVar18 * 4) *
                                       *(float *)(*(long *)(plVar4[2] + 0x18) +
                                                  (long)(int)(((iVar2 * iVar20 * local_90) / iVar16
                                                              + iVar2 * local_80 + (int)lVar24) *
                                                             uVar14) * 4 + (long)(int)uVar14 * 4 +
                                                 ~uVar28 * 4);
                          }
                          else {
                            lVar19 = plVar3[7];
                            lVar21 = plVar4[0xe];
                            lVar6 = plVar4[0x10];
                            lVar7 = plVar3[3];
                            lVar8 = plVar3[5];
                            lVar9 = plVar4[0x12];
                            lVar27 = 0;
                            bVar12 = true;
                            do {
                              iVar18 = *(int *)(lVar19 + lVar27 * 4);
                              iVar17 = *(int *)(lVar21 + lVar27 * 4);
                              iVar22 = iVar18 * *(int *)(lVar6 + lVar27 * 4);
                              *(int *)(lVar6 + lVar27 * 4) = iVar22;
                              iVar22 = (*(int *)(lVar7 + lVar27 * 4) - (iVar17 + -1) * iVar18) +
                                       iVar22;
                              *(int *)(lVar6 + lVar27 * 4) = iVar22;
                              iVar22 = iVar22 + *(int *)(lVar9 + lVar27 * 4);
                              *(int *)(lVar6 + lVar27 * 4) = iVar22;
                              iVar18 = *(int *)(lVar8 + lVar27 * 4);
                              iVar17 = iVar22 / iVar18;
                              bVar10 = false;
                              bVar11 = false;
                              if (iVar22 % iVar18 == 0) {
                                *(int *)(lVar6 + lVar27 * 4) = iVar17;
                                if (iVar17 < 0) {
                                  bVar10 = false;
                                  bVar11 = false;
                                }
                                else {
                                  iVar18 = *(int *)(plVar4[10] + lVar27 * 4);
                                  bVar10 = iVar17 < iVar18;
                                  bVar11 = bVar12;
                                  if (iVar18 <= iVar17) {
                                    bVar11 = false;
                                  }
                                }
                              }
                            } while ((bVar10) &&
                                    (lVar27 = lVar27 + 1, bVar12 = bVar11,
                                    lVar27 < (int)plVar4[0x13]));
                            if (bVar11) goto LAB_0011cf34;
                          }
                          uVar28 = uVar28 + 1;
                        } while (uVar28 != uVar14);
                      }
                      lVar19 = *(long *)(plVar4[6] + 0x18) + (long)iVar26 * 4;
                      *(float *)(lVar19 + uVar25 * 4) = local_84 + *(float *)(lVar19 + uVar25 * 4);
                      uVar25 = uVar25 + 1;
                    } while (uVar25 != uVar13);
                  }
                  local_80 = local_80 + 1;
                  piVar23 = *(int **)(plVar4[2] + 8);
                  iVar20 = *piVar23;
                  iVar16 = (int)plVar3[8];
                } while (local_80 < iVar20 / iVar16);
              }
              if (plVar4[4] != 0 && 0 < (int)uVar13) {
                iVar16 = piVar23[1];
                lVar19 = *(long *)(plVar4[4] + 0x18);
                lVar21 = (long)iVar26 * 4 + *(long *)(plVar4[6] + 0x18);
                uVar25 = 0;
                do {
                  *(float *)(lVar21 + uVar25 * 4) =
                       *(float *)((long)local_90 * (long)iVar16 * 4 + lVar19 + lVar24 * 4) +
                       *(float *)(lVar21 + uVar25 * 4);
                  uVar25 = uVar25 + 1;
                } while (uVar13 != uVar25);
              }
              lVar24 = lVar24 + 1;
              uVar25 = (ulong)*(int *)(*(long *)(plVar4[2] + 8) + 4);
            } while (lVar24 < (long)uVar25);
          }
          local_90 = local_90 + 1;
        } while (local_90 < (int)plVar3[8]);
      }
      local_8c = local_8c + 1;
    } while (local_8c < *(int *)((long)plVar4 + 0x9c));
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_deconvolution(rt_function_t *f) {
  deconvolution_local_context_t *c =
      (deconvolution_local_context_t *)(f->local_context);
  deconvolution_private_t *p = (deconvolution_private_t *)(c->data);

  int output_size = calc_shape_size(p->output_shape);
  int kernel_size = calc_shape_size(p->kernel_shape);
  int input_size = calc_shape_size(p->input_shape);

  memset(p->output->data, 0, sizeof(float) * calc_shape_size(p->output->shape));

  for (int b = 0; b < p->base_loop_size; b++) {
    for (int g = 0; g < c->group; g++) {
      for (int om = 0; om < p->weight->shape.data[1]; om++) {
        int output_offset = (b * c->group * p->weight->shape.data[1] +
                             g * p->weight->shape.data[1] + om) *
                            output_size;
        for (int im = 0; im < p->weight->shape.data[0] / c->group; im++) {
          int input_offset = (b * p->weight->shape.data[0] +
                              g * p->weight->shape.data[0] / c->group + im) *
                             input_size;
          int kernel_offset = (g * p->weight->shape.data[1] *
                                   p->weight->shape.data[0] / c->group +
                               im * p->weight->shape.data[1] + om) *
                              kernel_size;
          for (int o = 0; o < output_size; o++) {
            float sum = 0.0f;
            pos_to_shape(p->out_position, p->output_shape, o);
            for (int k = 0; k < kernel_size; k++) {
              pos_to_shape(p->in_position, p->kernel_shape, k);
              uint8_t condition = 1;
              for (int j = 0; j < p->spatial_dims; j++) {
                int k1 =
                    c->dilation.data[j] * (p->kernel_shape.data[j] - 1) + 1;
                p->in_position.data[j] *= c->dilation.data[j];
                p->in_position.data[j] -= k1 - c->pad.data[j] - 1;
                p->in_position.data[j] += p->out_position.data[j];
                if (p->in_position.data[j] % c->stride.data[j] != 0) {
                  condition = 0;
                  break;
                }
                p->in_position.data[j] =
                    p->in_position.data[j] / c->stride.data[j];
                if (p->in_position.data[j] < 0 ||
                    p->in_position.data[j] >= p->input_shape.data[j]) {
                  condition = 0;
                  break;
                }
              }
              if (condition) {
                float x = *((float *)(p->input->data) + input_offset +
                            shape_to_pos(p->input_shape, p->in_position));
                float w = *((float *)(p->weight->data) + kernel_offset +
                            (kernel_size - k - 1));
                sum += x * w;
              }
            }
            *((float *)(p->output->data) + output_offset + o) += sum;
          }
        }
        if (p->bias) {
          for (int o = 0; o < output_size; o++) {
            *((float *)(p->output->data) + output_offset + o) +=
                *((float *)(p->bias->data) + g * p->weight->shape.data[1] + om);
          }
        }
      }
    }
  }

  return RT_FUNCTION_ERROR_NOERROR;
}